

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O2

int mbedtls_x509_sig_alg_gets
              (char *buf,size_t size,mbedtls_x509_buf *sig_oid,mbedtls_pk_type_t pk_alg,
              mbedtls_md_type_t md_alg,void *sig_opts)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *local_20;
  char *desc;
  
  local_20 = (char *)0x0;
  iVar1 = mbedtls_oid_get_sig_alg_desc(sig_oid,&local_20);
  if (iVar1 == 0) {
    uVar2 = snprintf(buf,size,"%s",local_20);
  }
  else {
    uVar2 = snprintf(buf,size,"???");
  }
  uVar3 = 0xffffd680;
  if (uVar2 < size) {
    uVar3 = uVar2;
  }
  if ((int)uVar2 < 0) {
    uVar3 = 0xffffd680;
  }
  return uVar3;
}

Assistant:

int mbedtls_x509_sig_alg_gets(char *buf, size_t size, const mbedtls_x509_buf *sig_oid,
                              mbedtls_pk_type_t pk_alg, mbedtls_md_type_t md_alg,
                              const void *sig_opts)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    const char *desc = NULL;

    ret = mbedtls_oid_get_sig_alg_desc(sig_oid, &desc);
    if (ret != 0) {
        ret = mbedtls_snprintf(p, n, "???");
    } else {
        ret = mbedtls_snprintf(p, n, "%s", desc);
    }
    MBEDTLS_X509_SAFE_SNPRINTF;

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    if (pk_alg == MBEDTLS_PK_RSASSA_PSS) {
        const mbedtls_pk_rsassa_pss_options *pss_opts;

        pss_opts = (const mbedtls_pk_rsassa_pss_options *) sig_opts;

        const char *name = md_type_to_string(md_alg);
        const char *mgf_name = md_type_to_string(pss_opts->mgf1_hash_id);

        ret = mbedtls_snprintf(p, n, " (%s, MGF1-%s, 0x%02X)",
                               name ? name : "???",
                               mgf_name ? mgf_name : "???",
                               (unsigned int) pss_opts->expected_salt_len);
        MBEDTLS_X509_SAFE_SNPRINTF;
    }
#else
    ((void) pk_alg);
    ((void) md_alg);
    ((void) sig_opts);
#endif /* MBEDTLS_X509_RSASSA_PSS_SUPPORT */

    return (int) (size - n);
}